

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lys_find_lypath_atoms(ly_path *path,ly_set **set)

{
  ly_path_predicate *plVar1;
  LY_ERR LVar2;
  ulong uVar3;
  char *pcVar4;
  ly_path_predicate *plVar5;
  long lVar6;
  ulong uVar7;
  
  if (path == (ly_path *)0x0) {
    pcVar4 = "path";
  }
  else {
    if (set != (ly_set **)0x0) {
      LVar2 = ly_set_new(set);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (path[-1].predicates != (ly_path_predicate *)0x0) {
        plVar5 = (ly_path_predicate *)0x0;
        do {
          LVar2 = ly_set_add(*set,path[(long)plVar5].node,'\0',(uint32_t *)0x0);
          if (LVar2 != LY_SUCCESS) goto LAB_00159c99;
          lVar6 = 8;
          uVar7 = 0;
          while( true ) {
            plVar1 = path[(long)plVar5].predicates;
            if (plVar1 == (ly_path_predicate *)0x0) {
              uVar3 = 0;
            }
            else {
              uVar3 = *(ulong *)((long)&plVar1[-1].field_1 + 0x28);
            }
            if (uVar3 <= uVar7) break;
            if (((*(uint *)((long)plVar1 + lVar6 + -8) | 2) == 3) &&
               (LVar2 = ly_set_add(*set,*(void **)((long)&plVar1->type + lVar6),'\0',(uint32_t *)0x0
                                  ), LVar2 != LY_SUCCESS)) goto LAB_00159c99;
            uVar7 = uVar7 + 1;
            lVar6 = lVar6 + 0x38;
          }
          plVar5 = (ly_path_predicate *)((long)&plVar5->type + 1);
        } while (plVar5 < path[-1].predicates);
      }
      LVar2 = LY_SUCCESS;
LAB_00159c99:
      if (LVar2 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      ly_set_free(*set,(_func_void_void_ptr *)0x0);
      *set = (ly_set *)0x0;
      return LVar2;
    }
    pcVar4 = "set";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar4,
         "lys_find_lypath_atoms");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_lypath_atoms(const struct ly_path *path, struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;

    LY_CHECK_ARG_RET(NULL, path, set, LY_EINVAL);

    /* allocate return set */
    LY_CHECK_RET(ly_set_new(set));

    LY_ARRAY_FOR(path, u) {
        /* add nodes from the path */
        LY_CHECK_GOTO(ret = ly_set_add(*set, (void *)path[u].node, 0, NULL), cleanup);
        LY_ARRAY_FOR(path[u].predicates, v) {
            if ((path[u].predicates[v].type == LY_PATH_PREDTYPE_LIST) || (path[u].predicates[v].type == LY_PATH_PREDTYPE_LIST_VAR)) {
                /* add all the keys in a predicate */
                LY_CHECK_GOTO(ret = ly_set_add(*set, (void *)path[u].predicates[v].key, 0, NULL), cleanup);
            }
        }
    }

cleanup:
    if (ret) {
        ly_set_free(*set, NULL);
        *set = NULL;
    }
    return ret;
}